

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::BitState<unsigned_int>,int,duckdb::BitXorOperation>
               (int *idata,AggregateInputData *aggr_input_data,BitState<unsigned_int> *state,
               idx_t count,ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = 0;
  uVar4 = 0;
  do {
    if (uVar4 == count + 0x3f >> 6) {
      return;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar6 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar6 = count;
      }
LAB_01b9fcac:
      for (; uVar3 = uVar5, uVar5 < uVar6; uVar5 = uVar5 + 1) {
        uVar7 = idata[uVar5];
        if (state->is_set == false) {
          state->is_set = true;
        }
        else {
          uVar7 = uVar7 ^ state->value;
        }
        state->value = uVar7;
      }
    }
    else {
      uVar2 = puVar1[uVar4];
      uVar6 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar6 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_01b9fcac;
      uVar3 = uVar6;
      if (uVar2 != 0) {
        for (uVar8 = 0; uVar3 = uVar5 + uVar8, uVar5 + uVar8 < uVar6; uVar8 = uVar8 + 1) {
          if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
            if (state->is_set == false) {
              state->value = idata[uVar5 + uVar8];
              state->is_set = true;
            }
            else {
              state->value = state->value ^ idata[uVar5 + uVar8];
            }
          }
        }
      }
    }
    uVar5 = uVar3;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static inline void NullaryScatterLoop(STATE_TYPE **__restrict states, AggregateInputData &aggr_input_data,
	                                      const SelectionVector &ssel, idx_t count) {

		for (idx_t i = 0; i < count; i++) {
			auto sidx = ssel.get_index(i);
			OP::template Operation<STATE_TYPE, OP>(*states[sidx], aggr_input_data, sidx);
		}
	}